

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Vec_Int_t * Wlc_NtkCollectMemFanins(Wlc_Ntk_t *p,Vec_Int_t *vMemObjs)

{
  int iVar1;
  int Entry;
  Vec_Int_t *p_00;
  Wlc_Obj_t *p_01;
  int i;
  
  p_00 = Vec_IntAlloc(100);
  for (i = 0; i < vMemObjs->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vMemObjs,i);
    p_01 = Wlc_NtkObj(p,iVar1);
    if ((*(ushort *)p_01 & 0x3f) - 0x36 < 2) {
      for (iVar1 = 0; iVar1 < (int)p_01->nFanins; iVar1 = iVar1 + 1) {
        if (iVar1 != 0) {
          Entry = Wlc_ObjFaninId(p_01,iVar1);
          Vec_IntPush(p_00,Entry);
        }
      }
    }
    else if ((*(ushort *)p_01 & 0x3f) == 8) {
      iVar1 = Wlc_ObjFaninId0(p_01);
      Vec_IntPush(p_00,iVar1);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectMemFanins( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs )
{
    Wlc_Obj_t * pObj; int i, k, iFanin;
    Vec_Int_t * vMemFanins = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            Vec_IntPush( vMemFanins, Wlc_ObjFaninId0(pObj) );
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
        {
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                if ( k > 0 )
                    Vec_IntPush( vMemFanins, iFanin );
        }
    }
    return vMemFanins;
}